

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void finalizeAggFunctions(Parse *pParse,AggInfo *pAggInfo)

{
  Vdbe *p;
  int local_4c;
  ExprList *pList;
  AggInfo_func *pF;
  int i;
  Vdbe *v;
  AggInfo *pAggInfo_local;
  Parse *pParse_local;
  
  p = pParse->pVdbe;
  pF._4_4_ = 0;
  pList = (ExprList *)pAggInfo->aFunc;
  for (; pF._4_4_ < pAggInfo->nFunc; pF._4_4_ = pF._4_4_ + 1) {
    if (*(int **)(*(long *)pList + 0x20) == (int *)0x0) {
      local_4c = 0;
    }
    else {
      local_4c = **(int **)(*(long *)pList + 0x20);
    }
    sqlite3VdbeAddOp2(p,0x96,*(int *)&pList->a[0].zName,local_4c);
    sqlite3VdbeAppendP4(p,pList->a[0].pExpr,-8);
    pList = (ExprList *)&pList->a[0].zSpan;
  }
  return;
}

Assistant:

static void finalizeAggFunctions(Parse *pParse, AggInfo *pAggInfo){
  Vdbe *v = pParse->pVdbe;
  int i;
  struct AggInfo_func *pF;
  for(i=0, pF=pAggInfo->aFunc; i<pAggInfo->nFunc; i++, pF++){
    ExprList *pList = pF->pExpr->x.pList;
    assert( !ExprHasProperty(pF->pExpr, EP_xIsSelect) );
    sqlite3VdbeAddOp2(v, OP_AggFinal, pF->iMem, pList ? pList->nExpr : 0);
    sqlite3VdbeAppendP4(v, pF->pFunc, P4_FUNCDEF);
  }
}